

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O0

void __thiscall Tree<int>::levelEasyTraversal(Tree<int> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pvVar3;
  Node<int> *pNVar4;
  undefined1 local_a0 [8];
  Node<int> node;
  undefined1 local_60 [8];
  queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_> myQueue;
  Tree<int> *this_local;
  
  myQueue.c.super__Deque_base<Node<int>,_std::allocator<Node<int>_>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_node = (_Map_pointer)this;
  std::queue<Node<int>,std::deque<Node<int>,std::allocator<Node<int>>>>::
  queue<std::deque<Node<int>,std::allocator<Node<int>>>,void>
            ((queue<Node<int>,std::deque<Node<int>,std::allocator<Node<int>>>> *)local_60);
  iVar2 = (*this->_vptr_Tree[8])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*this->_vptr_Tree[8])();
    std::queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_>::push
              ((queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_> *)local_60,
               (value_type *)CONCAT44(extraout_var_00,iVar2));
  }
  while (bVar1 = std::queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_>::empty
                           ((queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_> *
                            )local_60), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_>::front
                       ((queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_> *)
                        local_60);
    Node<int>::Node((Node<int> *)local_a0,pvVar3);
    std::queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_>::pop
              ((queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_> *)local_60);
    doSomeThing(this,(Node<int> *)local_a0);
    pNVar4 = Node<int>::getLeftPoint((Node<int> *)local_a0);
    if (pNVar4 != (Node<int> *)0x0) {
      pNVar4 = Node<int>::getLeftPoint((Node<int> *)local_a0);
      std::queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_>::push
                ((queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_> *)local_60,
                 pNVar4);
    }
    pNVar4 = Node<int>::getRightPoint((Node<int> *)local_a0);
    if (pNVar4 != (Node<int> *)0x0) {
      pNVar4 = Node<int>::getRightPoint((Node<int> *)local_a0);
      std::queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_>::push
                ((queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_> *)local_60,
                 pNVar4);
    }
  }
  std::queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_>::~queue
            ((queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_> *)local_60);
  return;
}

Assistant:

virtual void levelEasyTraversal(void){
        //queue of std
        queue< Node<T> >  myQueue;
        if (getRoot() != nullptr){
            myQueue.push(* getRoot()); // this function receive reference var
        }
        while (!myQueue.empty()){
            //get the first node
            Node<T> node = myQueue.front();
            //pop
            myQueue.pop();
            //my business logic, call back
            doSomeThing(&node);
            //deal with children
            if (node.getLeftPoint() != nullptr){
                myQueue.push(* node.getLeftPoint());
            }
            if (node.getRightPoint() != nullptr){
                myQueue.push(* node.getRightPoint());
            }
        }
    }